

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O0

int __thiscall GrcFont::ReadData(GrcFont *this,byte **ppData,ptrdiff_t lnOffset,size_t lnSize)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  ulong in_RCX;
  long in_RDX;
  long *in_RSI;
  long in_RDI;
  allocator local_a9;
  string local_a8 [32];
  string *in_stack_ffffffffffffff78;
  GdlObject *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  GrcErrorList *in_stack_ffffffffffffff90;
  allocator local_49;
  string local_48 [32];
  ulong local_28;
  long local_20;
  long *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pvVar2 = operator_new__(in_RCX);
  *local_18 = (long)pvVar2;
  if (*local_18 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,"Memory failure: could not allocate ppData array while reading font file",
               &local_49);
    GrcErrorList::AddError
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_4 = 0;
  }
  else {
    iVar1 = fseek(*(FILE **)(in_RDI + 8),local_20,0);
    if (iVar1 == 0) {
      sVar3 = fread((void *)*local_18,local_28,1,*(FILE **)(in_RDI + 8));
      if (sVar3 == 1) {
        local_4 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_a8,"Could not read requested data from font file",&local_a9);
        GrcErrorList::AddError
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,
                   in_stack_ffffffffffffff78);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        local_4 = 0;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff80,"Could not seek to correct place in font file",
                 (allocator *)&stack0xffffffffffffff7f);
      GrcErrorList::AddError
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff78);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int GrcFont::ReadData(gr::byte ** ppData, ptrdiff_t lnOffset, size_t lnSize)
{
	*ppData = new gr::byte[lnSize];
	if (!*ppData)
	{
		g_errorList.AddError(125, NULL, 
			"Memory failure: could not allocate ppData array while reading font file");
		return false;
	}
	if (fseek(m_pFile, long(lnOffset), SEEK_SET))
	{
		g_errorList.AddError(126, NULL, 
			"Could not seek to correct place in font file");
		return false;
	}
	if (fread(*ppData, lnSize, 1, m_pFile) != 1)
	{
		g_errorList.AddError(127, NULL, 
			"Could not read requested data from font file");
		return false;
	}
	return true;
}